

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

int proto_action_in_stage(proto_action *act,action_class stage)

{
  action_value aVar1;
  byte bVar2;
  
  switch(stage) {
  case Immediate:
    aVar1 = act->action_type;
    break;
  case Immediate_and_Multi:
    aVar1 = act->action_type;
    bVar2 = 1;
    if (aVar1 == Action_Multi) goto LAB_00137910;
    break;
  case Bridge:
    bVar2 = act->action_type == Action_Bridge;
    goto LAB_00137910;
  case Congestion:
    bVar2 = act->action_type == Action_Congestion;
    goto LAB_00137910;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                  ,0x49a,"int proto_action_in_stage(proto_action *, action_class)");
  }
  if (aVar1 < Action_Congestion) {
    bVar2 = (byte)(0x638 >> ((byte)aVar1 & 0x1f));
  }
  else {
    bVar2 = 0;
  }
LAB_00137910:
  return bVar2 & 1;
}

Assistant:

static int
proto_action_in_stage(proto_action *act, action_class stage) {
    switch (stage) {
    case Immediate_and_Multi:
        if (act->action_type == Action_Multi) return 1;
        /* fallthrough */
    case Immediate:
        switch (act->action_type) {
        case Action_Terminal:
        case Action_Filter:
        case Action_Split:
        case Action_Immediate:
        case Action_Store:
            return 1;
        default:
            return 0;
        }
    case Bridge:
        return act->action_type == Action_Bridge;
    case Congestion:
        return act->action_type == Action_Congestion;
    default:
        assert(0);
    }
    return 0;
}